

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consumer.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int fd;
  Message *this;
  char *pcVar1;
  uint uVar2;
  
  fd = open("shared.dat",2,0x1b6);
  if (fd != -1) {
    this = Message::GetFromMemoryMappedFile(fd);
    uVar2 = 1;
    do {
      pcVar1 = Message::DequeueMessage(this);
      printf("%d: %s",(ulong)uVar2,pcVar1);
      fflush(_stdout);
      uVar2 = uVar2 + 1;
    } while( true );
  }
  puts("open returned (-1)");
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{

    const char *sharedFileName = "shared.dat";
    const mode_t mode = 0666;
    const int openFlags = (O_RDWR);
    int fd = open(sharedFileName, openFlags, mode);

    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    Message* msg = Message::GetFromMemoryMappedFile(fd);

    int count = 0;

    while(1)
    {
        char *message = msg->DequeueMessage();
        printf("%d: %s", ++count, message);
        fflush(stdout);
    }

    Message::ReleaseFile(msg, fd);

    close(fd);
}